

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O2

bool __thiscall VMState::InitVar(VMState *this,int pos,ExpressionPtr *exp,bool foreachInit)

{
  element_type *peVar1;
  undefined8 *puVar2;
  int64_t startAddress;
  int64_t endAddress;
  __type _Var3;
  int iVar4;
  long lVar5;
  NutFunction *pNVar6;
  LocalVarInitStatement *this_00;
  LocalVariableExpression *this_01;
  Error *this_02;
  ExpressionPtr *pEVar7;
  undefined4 in_register_00000034;
  ulong stackAddress;
  pointer __rhs;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_78;
  long local_60;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *local_58;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_50;
  StatementPtr local_40;
  
  pEVar7 = exp;
  if ((pos < 0) ||
     (lVar5 = (long)(this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_Stack).
                    super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_start,
     pEVar7 = (ExpressionPtr *)(lVar5 % 0x28), (int)(lVar5 / 0x28) <= pos)) {
    this_02 = (Error *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,pos),pEVar7);
    Error::Error(this_02,"Accessing non valid stack position.");
    __cxa_throw(this_02,&Error::typeinfo,Error::~Error);
  }
  peVar1 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar4 = (**peVar1->_vptr_Expression)(), iVar4 == 2)) {
    local_78._M_ptr = (element_type *)0x0;
    local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  }
  pNVar6 = this->m_Parent;
  __rhs = (pNVar6->m_Locals).
          super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>.
          _M_impl.super__Vector_impl_data._M_start;
  stackAddress = (ulong)(uint)pos;
  local_58 = &exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (__rhs == (pNVar6->m_Locals).
                 super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    if ((__rhs->pos == stackAddress) && (__rhs->foreachLoopState == foreachInit)) {
      lVar5 = (long)this->m_IP;
      if ((__rhs->start_op == lVar5) ||
         ((__rhs->start_op <= lVar5 && foreachInit && (lVar5 <= __rhs->end_op)))) {
        puVar2 = &((this->m_Stack).
                   super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                   ._M_impl.super__Vector_impl_data._M_start[stackAddress].expression.
                   super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_Expression;
        if ((puVar2 != (undefined8 *)0x0) && (iVar4 = (**(code **)*puVar2)(), iVar4 == 4)) {
          std::static_pointer_cast<LocalVariableExpression,Expression>
                    ((shared_ptr<Expression> *)&local_78);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_78._M_ptr + 1),&__rhs->name);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
          if (_Var3) {
            return false;
          }
        }
        if (((__rhs->end_op <= (long)(this->m_BlockState).blockEnd) ||
            ((this->m_BlockState).inLoop != '\0')) || ((this->m_BlockState).inSwitch != '\0')) {
          lVar5 = stackAddress * 0x28;
          if (!foreachInit) {
            local_60 = stackAddress * 0x28;
            this_00 = (LocalVarInitStatement *)operator_new(0x60);
            startAddress = __rhs->start_op;
            endAddress = __rhs->end_op;
            std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_50,local_58);
            LocalVarInitStatement::LocalVarInitStatement
                      (this_00,&__rhs->name,stackAddress,startAddress,endAddress,
                       (ExpressionPtr *)&local_50);
            std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<LocalVarInitStatement,void>
                      ((__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> *)&local_40,this_00);
            PushStatement(this,&local_40);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_40.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
            lVar5 = local_60;
          }
          this_01 = (LocalVariableExpression *)operator_new(0x28);
          LocalVariableExpression::LocalVariableExpression(this_01,&__rhs->name);
          std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<LocalVariableExpression,void>
                    ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)&local_78,this_01);
          std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(((this->m_Stack).
                               super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                               ._M_impl.super__Vector_impl_data._M_start)->expression).
                             super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                     lVar5),&local_78);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
          std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::
          clear((vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> *)
                ((long)&(((this->m_Stack).
                          super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pendingStatements).
                        super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5));
          return true;
        }
        pNVar6 = this->m_Parent;
      }
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

bool InitVar( int pos, ExpressionPtr exp = ExpressionPtr(), bool foreachInit = false )
	{
		if (pos < 0 || pos >= (int)m_Stack.size())
			throw Error("Accessing non valid stack position.");

		if (exp && exp->GetType() == Exp_Null)
			exp = ExpressionPtr();

		// Check for local initialization
		for( vector<NutFunction::LocalVarInfo>::const_iterator i = m_Parent.m_Locals.begin(); i != m_Parent.m_Locals.end(); ++i)
		{
			// Variable stack address
			if (i->pos != pos) continue;

			// Match foreach state variables
			if (i->foreachLoopState != foreachInit) continue;

			// Variable scope range
			if (m_IP != i->start_op && (!foreachInit || m_IP < i->start_op || m_IP > i->end_op)) continue;

			if (m_Stack[pos].expression && m_Stack[pos].expression->GetType() == Exp_LocalVariable 
				&& static_pointer_cast<LocalVariableExpression>(m_Stack[pos].expression)->GetVariableName() == i->name)
			{
				// This variable is already initialized
				break;
			}

			if (i->end_op > m_BlockState.blockEnd && m_BlockState.inLoop == 0 && m_BlockState.inSwitch == 0)
			{
				// Initialization of variable that reaches out of current if block - ignore
				continue;
			}

			// This is local initialization
			if (!foreachInit)
			{
				PushStatement(StatementPtr(new LocalVarInitStatement(i->name, pos, i->start_op, i->end_op, exp)));
			}

			m_Stack[pos].expression = ExpressionPtr(new LocalVariableExpression(i->name));
			m_Stack[pos].pendingStatements.clear();

			return true;
		}

		return false;
	}